

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFrontSym.cpp
# Opt level: O3

void __thiscall
TPZFrontSym<std::complex<long_double>_>::Compress(TPZFrontSym<std::complex<long_double>_> *this)

{
  long lVar1;
  long *plVar2;
  long *plVar3;
  long lVar4;
  complex<long_double> *pcVar5;
  ulong uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  int64_t iVar18;
  long lVar19;
  TPZStack<long,_10> from;
  TPZManVector<long,_10> TStack_98;
  
  TPZStack<long,_10>::TPZStack((TPZStack<long,_10> *)&TStack_98);
  lVar10 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  if (0 < lVar10) {
    lVar19 = 0;
    do {
      if ((this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore
          [lVar19] != -1) {
        TPZStack<long,_10>::Push((TPZStack<long,_10> *)&TStack_98,lVar19);
        lVar10 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
      }
      lVar19 = lVar19 + 1;
    } while (lVar19 < lVar10);
  }
  if (TStack_98.super_TPZVec<long>.fNElements < 1) {
    lVar10 = 0;
  }
  else {
    plVar2 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
    plVar3 = (this->super_TPZFront<std::complex<long_double>_>).fLocal.fStore;
    lVar19 = 0;
    do {
      lVar10 = plVar2[TStack_98.super_TPZVec<long>.fStore[lVar19]];
      plVar2[lVar19] = lVar10;
      plVar3[lVar10] = lVar19;
      lVar19 = lVar19 + 1;
      lVar10 = TStack_98.super_TPZVec<long>.fNElements;
    } while (TStack_98.super_TPZVec<long>.fNElements != lVar19);
  }
  if (lVar10 < (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
               fNElements) {
    plVar2 = (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.fStore;
    lVar19 = lVar10;
    do {
      plVar2[lVar19] = -1;
      lVar19 = lVar19 + 1;
    } while (lVar19 < (this->super_TPZFront<std::complex<long_double>_>).fGlobal.super_TPZVec<long>.
                      fNElements);
  }
  iVar18 = (this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>.
           super_TPZVec<int>.fNElements + TStack_98.super_TPZVec<long>.fNElements;
  if (iVar18 != (this->super_TPZFront<std::complex<long_double>_>).fFront) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZFront.Compress inconsistent data structure\n",0x2e);
    iVar18 = (this->super_TPZFront<std::complex<long_double>_>).fFront;
  }
  (this->super_TPZFront<std::complex<long_double>_>).fFront =
       TStack_98.super_TPZVec<long>.fNElements;
  TPZManVector<int,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fFree.super_TPZManVector<int,_10>,0
            );
  TPZManVector<long,_10>::Resize
            (&(this->super_TPZFront<std::complex<long_double>_>).fGlobal,
             (this->super_TPZFront<std::complex<long_double>_>).fFront);
  if ((this->super_TPZFront<std::complex<long_double>_>).fData.fNElements != 0) {
    if (TStack_98.super_TPZVec<long>.fNElements < 1) {
      TStack_98.super_TPZVec<long>.fNElements = 0;
    }
    else {
      lVar11 = 1;
      lVar12 = 2;
      lVar13 = 0;
      lVar19 = 0;
      do {
        lVar14 = lVar13 << 4;
        lVar1 = lVar19 + 1;
        lVar15 = 0;
        do {
          lVar4 = TStack_98.super_TPZVec<long>.fStore[lVar15];
          lVar16 = TStack_98.super_TPZVec<long>.fStore[lVar19];
          lVar17 = lVar16;
          if (lVar16 < lVar4) {
            lVar17 = lVar4;
          }
          if (lVar4 < lVar16) {
            lVar16 = lVar4;
          }
          lVar17 = (lVar17 + 1) * lVar17;
          pcVar5 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
          uVar6 = lVar17 - (lVar17 >> 0x3f) & 0xffffffffffffffe;
          uVar7 = *(undefined8 *)(pcVar5[lVar16]._M_value + uVar6 * 0x10);
          uVar8 = *(undefined8 *)((long)(pcVar5[lVar16]._M_value + uVar6 * 0x10) + 8);
          uVar9 = *(undefined8 *)((long)(pcVar5[lVar16]._M_value + uVar6 * 0x10 + 0x10) + 8);
          *(undefined8 *)(pcVar5->_M_value + lVar14 + 0x10) =
               *(undefined8 *)(pcVar5[lVar16]._M_value + uVar6 * 0x10 + 0x10);
          *(undefined8 *)((long)(pcVar5->_M_value + lVar14 + 0x10) + 8) = uVar9;
          *(undefined8 *)(pcVar5->_M_value + lVar14) = uVar7;
          *(undefined8 *)((long)(pcVar5->_M_value + lVar14) + 8) = uVar8;
          lVar15 = lVar15 + 1;
          lVar14 = lVar14 + 0x20;
        } while (lVar11 != lVar15);
        lVar11 = lVar11 + 1;
        lVar13 = lVar13 + lVar12;
        lVar12 = lVar12 + 2;
        lVar19 = lVar1;
      } while (lVar1 != TStack_98.super_TPZVec<long>.fNElements);
    }
    if (TStack_98.super_TPZVec<long>.fNElements < (int)iVar18) {
      do {
        lVar19 = lVar10 + 1;
        lVar11 = 0;
        do {
          lVar12 = lVar10;
          if (lVar10 < lVar11) {
            lVar12 = lVar11;
          }
          lVar13 = lVar10;
          if (lVar11 < lVar10) {
            lVar13 = lVar11;
          }
          uVar6 = (lVar12 + 1) * lVar12 & 0xffffffffffffffe;
          pcVar5 = (this->super_TPZFront<std::complex<long_double>_>).fData.fStore;
          *(longdouble *)(pcVar5[lVar13]._M_value + uVar6 * 0x10) = (longdouble)0;
          *(longdouble *)(pcVar5[lVar13]._M_value + uVar6 * 0x10 + 0x10) = (longdouble)0;
          lVar11 = lVar11 + 1;
        } while (lVar19 != lVar11);
        lVar10 = lVar19;
      } while (lVar19 != (int)iVar18);
    }
  }
  TPZManVector<long,_10>::~TPZManVector(&TStack_98);
  return;
}

Assistant:

void TPZFrontSym<TVar>::Compress(){
	//	PrintGlobal("Before COmpress",output);
	//	Print("Before Compress", cout);
	TPZStack <int64_t> from;
	int64_t nfound;
	int64_t i, j;
	for(i = 0; i < this->fFront; i++){
		if(this->fGlobal[i] != -1) from.Push(i);
	}
	
	/**
	 *First this->fLocal initialization
	 *Any needed updates is done on next loop
	 */
	nfound = from.NElements();
	for(i=0;i<nfound;i++) {
		this->fGlobal[i]=this->fGlobal[from[i]];
		//fGlobal[from[i]] = -1;
		this->fLocal[this->fGlobal[i]] = i;
	}
	for(;i<this->fGlobal.NElements();i++) this->fGlobal[i] = -1;
	
	if(nfound+this->fFree.NElements()!=this->fFront) cout << "TPZFront.Compress inconsistent data structure\n";
	int frontold = this->fFront;
	this->fFront = nfound;
	this->fFree.Resize(0);	
	this->fGlobal.Resize(this->fFront);
	if(this->fData.NElements()==0) return;
	
	for(j = 0; j < nfound; j++){
		for(i = 0; i <= j; i++){
			Element(i,j) = Element(from[i], from[j]);
		}
		//		fGlobal[i] = fGlobal[from[i]];
		//		this->fLocal[fGlobal[i]] = i;
	}
	for(;j<frontold;j++) {
		for(i=0;i<= j; i++) Element(i,j) = 0.;
	}
	
	//	Print("After Compress", cout);
	//	PrintGlobal("After Compress",output);
}